

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O2

natwm_error client_configure_window(natwm_state *state,xcb_configure_request_event_t *event)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  workspace *workspace;
  client *client;
  monitor *monitor;
  xcb_rectangle_t xVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  undefined1 local_48 [8];
  xcb_configure_request_event_t new_event;
  
  workspace = workspace_list_find_window_workspace(state->workspace_list,event->window);
  if (workspace != (workspace *)0x0) {
    client = workspace_find_window_client(workspace,event->window);
    monitor = monitor_list_get_workspace_monitor(state->monitor_list,workspace);
    if (monitor == (monitor *)0x0 || client == (client *)0x0) {
      return RESOLUTION_FAILURE;
    }
    uVar10 = (client->rect).x;
    uVar1 = (client->rect).y;
    local_48[0] = event->response_type;
    local_48[1] = event->stack_mode;
    local_48._2_2_ = event->sequence;
    local_48._4_4_ = event->parent;
    uVar5 = event->window;
    uVar6 = event->sibling;
    uVar7 = event->x;
    uVar8 = event->y;
    new_event._12_8_ = *(undefined8 *)&event->width;
    uVar2 = event->value_mask;
    if ((uVar2 & 1) != 0) {
      uVar10 = event->x;
    }
    if ((uVar2 & 2) != 0) {
      uVar1 = event->y;
    }
    uVar11 = (uint)(client->rect).width;
    if ((uVar2 & 4) != 0) {
      uVar3 = event->width;
      uVar11 = client->size_hints->min_width;
      if ((int)uVar11 <= (int)(uint)uVar3) {
        uVar12 = client->size_hints->max_width;
        uVar11 = (uint)uVar3;
        if ((int)uVar12 < (int)(uint)uVar3) {
          uVar11 = uVar12;
        }
      }
    }
    uVar12 = (uint)(client->rect).height;
    if ((uVar2 & 8) != 0) {
      uVar2 = event->height;
      uVar12 = client->size_hints->min_height;
      if ((int)uVar12 <= (int)(uint)uVar2) {
        uVar4 = client->size_hints->max_height;
        uVar12 = (uint)uVar2;
        if ((int)uVar4 < (int)(uint)uVar2) {
          uVar12 = uVar4;
        }
      }
    }
    new_event._0_4_ = uVar5;
    new_event.parent = uVar6;
    new_event.window._0_2_ = uVar7;
    new_event.window._2_2_ = uVar8;
    xVar9 = monitor_clamp_client_rect
                      (monitor,(xcb_rectangle_t)
                               ((ulong)uVar10 |
                               (ulong)uVar1 << 0x10 |
                               (ulong)(uVar11 & 0xffff) << 0x20 | (ulong)(uVar12 & 0xffff) << 0x30))
    ;
    client->rect = xVar9;
    new_event.window._0_2_ = xVar9.x;
    new_event.window._2_2_ = xVar9.y;
    new_event.sibling = xVar9._4_4_;
    if ((event->value_mask & 0x40) != 0) {
      if (event->sibling != 0) {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Specifying stacking order with sibling is not supported yet - Unfortunate behavior may occur."
                       );
      }
      if (event->stack_mode == '\x01') {
        workspace_unfocus_client(state,workspace,client);
      }
      else if (event->stack_mode == '\0') {
        workspace_focus_client(state,workspace,client);
      }
      else {
        internal_logger(natwm_logger,LEVEL_WARNING,
                        "Encountered unsupported stacking order - Ignoring");
      }
    }
    handle_configure_request(state->xcb,(xcb_configure_request_event_t *)local_48);
  }
  handle_configure_request(state->xcb,event);
  return NO_ERROR;
}

Assistant:

enum natwm_error client_configure_window(struct natwm_state *state,
                                         xcb_configure_request_event_t *event)
{
        struct workspace *workspace
                = workspace_list_find_window_workspace(state->workspace_list, event->window);

        if (workspace == NULL) {
                // window is not registered with us - just pass it along
                goto handle_not_registered;
        }

        struct client *client = workspace_find_window_client(workspace, event->window);
        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (client == NULL || monitor == NULL) {
                return RESOLUTION_FAILURE;
        }

        xcb_rectangle_t new_rect = client->rect;
        xcb_configure_request_event_t new_event = *event;

        if (event->value_mask & XCB_CONFIG_WINDOW_X) {
                new_rect.x = event->x;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_Y) {
                new_rect.y = event->y;
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_WIDTH) {
                if (event->width < client->size_hints->min_width) {
                        new_rect.width = (uint16_t)client->size_hints->min_width;
                } else if (event->width > client->size_hints->max_width) {
                        new_rect.width = (uint16_t)client->size_hints->max_width;
                } else {
                        new_rect.width = event->width;
                }
        }

        if (event->value_mask & XCB_CONFIG_WINDOW_HEIGHT) {
                if (event->height < client->size_hints->min_height) {
                        new_rect.height = (uint16_t)client->size_hints->min_height;
                } else if (event->height > client->size_hints->max_height) {
                        new_rect.height = (uint16_t)client->size_hints->max_height;
                } else {
                        new_rect.height = event->height;
                }
        }

        client->rect = monitor_clamp_client_rect(monitor, new_rect);

        new_event.x = client->rect.x;
        new_event.y = client->rect.y;
        new_event.width = client->rect.width;
        new_event.height = client->rect.height;

        if (event->value_mask & XCB_CONFIG_WINDOW_STACK_MODE) {
                if (event->sibling != XCB_NONE) {
                        LOG_WARNING(natwm_logger,
                                    "Specifying stacking order with sibling is "
                                    "not supported yet - Unfortunate behavior "
                                    "may occur.");
                }

                if (event->stack_mode == XCB_STACK_MODE_ABOVE) {
                        workspace_focus_client(state, workspace, client);

                } else if (event->stack_mode == XCB_STACK_MODE_BELOW) {
                        workspace_unfocus_client(state, workspace, client);
                } else {
                        // TODO: Support XCB_STACK_MODE_{OPPOSITE, TOP_IF,
                        // BOTTOM_IF}
                        LOG_WARNING(natwm_logger,
                                    "Encountered unsupported stacking order - "
                                    "Ignoring");
                }
        }

        handle_configure_request(state->xcb, &new_event);

handle_not_registered:
        handle_configure_request(state->xcb, event);

        return NO_ERROR;
}